

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit.cc
# Opt level: O0

void ResourceConsumingWorker(void)

{
  ostream *poVar1;
  int i;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_00000020;
  bool local_11;
  duration<long,std::ratio<1l,1000l>> local_10 [12];
  int local_4;
  
  local_4 = 0;
  while( true ) {
    local_11 = false;
    if (local_4 < 100) {
      local_11 = LimitEffort::ShouldContinue();
    }
    if (local_11 == false) break;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_4);
    std::operator<<(poVar1,' ');
    LimitEffort::Consume(0);
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_10,&local_4);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_00000020);
    local_4 = local_4 + 1;
  }
  std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ResourceConsumingWorker() {
  for (int i = 0; i < 100 && LimitEffort::ShouldContinue(); ++i) {
    std::cerr << i << ' ';
    LimitEffort::Consume(i);
    std::this_thread::sleep_for(std::chrono::milliseconds(i));
  }
  std::cerr << std::endl;
}